

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Connection_testTeach_Test::TestBody(Connection_testTeach_Test *this)

{
  char *pcVar1;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  float local_44;
  Connection local_40;
  Connection s;
  
  Connection::Connection(&s,(Neuron *)0x0,10.0,100.0,100.0);
  Connection::teach(&s,1.0);
  Connection::Connection(&local_40,(Neuron *)0x0,11.0,100.0,100.0);
  local_60.data_._0_4_ = Connection::weight(&local_40);
  local_44 = Connection::weight(&s);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"Connection(0, 11).weight()","s.weight()",(float *)&local_60,
             &local_44);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Connection::teach(&s,10.0);
  Connection::Connection(&local_40,(Neuron *)0x0,21.0,100.0,100.0);
  local_60.data_._0_4_ = Connection::weight(&local_40);
  local_44 = Connection::weight(&s);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"Connection(0, 21).weight()","s.weight()",(float *)&local_60,
             &local_44);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Connection, testTeach)
{
    Connection s(0, 10);
    s.teach(1);
    EXPECT_EQ(Connection(0, 11).weight(), s.weight());
    s.teach(10);
    EXPECT_EQ(Connection(0, 21).weight(), s.weight());
}